

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_rect_pack.h
# Opt level: O1

void stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_rect *psVar1;
  ushort uVar2;
  stbrp_node *psVar3;
  stbrp_context *psVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  stbrp_node **ppsVar8;
  long lVar9;
  ulong uVar10;
  stbrp_node *psVar11;
  stbrp_node **ppsVar12;
  stbrp_context *psVar13;
  stbrp_node *in_R8;
  stbrp_node *psVar14;
  uint uVar15;
  stbrp_context *psVar16;
  int iVar17;
  ulong uVar18;
  int waste;
  int local_94;
  int local_90;
  int local_8c;
  ulong local_88;
  stbrp_node **local_80;
  int local_78;
  int local_74;
  stbrp_node **local_70;
  ulong local_68;
  ulong local_60;
  stbrp_rect *local_58;
  ulong local_50;
  ulong local_48;
  stbrp_rect *local_40;
  size_t local_38;
  
  uVar18 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    piVar6 = &rects->was_packed;
    uVar10 = 0;
    do {
      *piVar6 = (int)uVar10;
      uVar10 = uVar10 + 1;
      piVar6 = piVar6 + 4;
    } while (uVar18 != uVar10);
  }
  local_38 = (size_t)num_rects;
  local_78 = num_rects;
  qsort(rects,local_38,0x10,rect_height_compare);
  if (0 < num_rects) {
    local_70 = &context->active_head;
    uVar10 = 0;
    local_60 = uVar18;
    local_58 = rects;
    do {
      psVar1 = rects + uVar10;
      uVar2 = rects[uVar10].w;
      uVar7 = (ulong)uVar2;
      if ((uVar2 == 0) || (local_68 = (ulong)psVar1->h, psVar1->h == 0)) {
        psVar1->x = 0;
        psVar1->y = 0;
      }
      else {
        iVar5 = context->align;
        iVar17 = (uint)uVar2 + iVar5 + -1;
        iVar17 = iVar17 - iVar17 % iVar5;
        local_50 = uVar7;
        local_40 = psVar1;
        if (iVar17 % iVar5 != 0) {
          __assert_fail("width % c->align == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_rect_pack.h"
                        ,0x14e,
                        "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)")
          ;
        }
        uVar2 = (ushort)((stbrp_context *)context->active_head)->width;
        if (context->width < (int)(iVar17 + (uint)uVar2)) {
          local_94 = 0x40000000;
          local_80 = (stbrp_node **)0x0;
          local_90 = 0x40000000;
        }
        else {
          local_90 = 0x40000000;
          local_80 = (stbrp_node **)0x0;
          local_94 = 0x40000000;
          ppsVar12 = local_70;
          psVar13 = (stbrp_context *)context->active_head;
          do {
            iVar5 = stbrp__skyline_find_min_y
                              (psVar13,(stbrp_node *)(ulong)uVar2,iVar17,(int)&local_8c,(int *)in_R8
                              );
            if (context->heuristic == 0) {
              if (iVar5 < local_94) {
                local_94 = iVar5;
                local_80 = ppsVar12;
              }
            }
            else if (((int)local_68 + iVar5 <= context->height) &&
                    ((iVar5 < local_94 || ((iVar5 == local_94 && (local_8c < local_90)))))) {
              local_90 = local_8c;
              local_94 = iVar5;
              local_80 = ppsVar12;
            }
            ppsVar12 = (stbrp_node **)&psVar13->align;
            uVar2 = (ushort)(*(stbrp_context **)&psVar13->align)->width;
            psVar13 = *(stbrp_context **)&psVar13->align;
          } while ((int)(iVar17 + (uint)uVar2) <= context->width);
        }
        if (local_80 == (stbrp_node **)0x0) {
          local_88 = 0;
        }
        else {
          local_88 = (ulong)(*local_80)->x;
        }
        local_48 = uVar10;
        if (context->heuristic == 1) {
          psVar13 = (stbrp_context *)*local_70;
          uVar2 = (ushort)psVar13->width;
          psVar16 = psVar13;
          while (ppsVar12 = local_70, (int)(uint)uVar2 < iVar17) {
            psVar16 = *(stbrp_context **)&psVar16->align;
            uVar2 = (ushort)psVar16->width;
          }
          do {
            uVar15 = (uint)(ushort)psVar16->width - iVar17;
            psVar4 = psVar13;
            if ((int)uVar15 < 0) {
              __assert_fail("xpos >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_rect_pack.h"
                            ,0x187,
                            "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                           );
            }
            do {
              psVar13 = psVar4;
              ppsVar8 = ppsVar12;
              ppsVar12 = (stbrp_node **)&psVar13->align;
              psVar4 = *(stbrp_context **)&psVar13->align;
            } while ((int)(uint)(ushort)(*(stbrp_context **)&psVar13->align)->width <= (int)uVar15);
            if ((int)uVar15 < (int)(uint)(ushort)psVar13->width) {
              __assert_fail("node->next->x > xpos && node->x <= xpos",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_rect_pack.h"
                            ,0x18d,
                            "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                           );
            }
            iVar5 = stbrp__skyline_find_min_y
                              (psVar13,(stbrp_node *)(ulong)uVar15,iVar17,(int)&local_74,
                               (int *)in_R8);
            if ((((int)local_68 + iVar5 < context->height) && (iVar5 <= local_94)) &&
               (((iVar5 < local_94 || (local_74 < local_90)) ||
                ((local_74 == local_90 && ((int)uVar15 < (int)local_88)))))) {
              local_90 = local_74;
              local_88 = (ulong)uVar15;
              local_94 = iVar5;
              local_80 = ppsVar8;
            }
            psVar16 = *(stbrp_context **)&psVar16->align;
            ppsVar12 = ppsVar8;
          } while (psVar16 != (stbrp_context *)0x0);
        }
        rects = local_58;
        uVar10 = local_48;
        uVar18 = local_60;
        if (((local_80 == (stbrp_node **)0x0) ||
            (iVar5 = (int)local_68 + local_94, context->height < iVar5)) ||
           (psVar3 = context->free_head, psVar3 == (stbrp_node *)0x0)) {
          local_40->x = 0xffff;
          local_40->y = 0xffff;
        }
        else {
          psVar3->x = (stbrp_coord)local_88;
          psVar3->y = (stbrp_coord)iVar5;
          context->free_head = psVar3->next;
          psVar14 = *local_80;
          iVar5 = (int)local_88;
          psVar11 = psVar14;
          ppsVar12 = local_80;
          if ((int)(uint)psVar14->x < iVar5) {
            psVar11 = psVar14->next;
            ppsVar12 = &psVar14->next;
          }
          *ppsVar12 = psVar3;
          in_R8 = psVar11->next;
          if (in_R8 != (stbrp_node *)0x0) {
            do {
              psVar14 = in_R8;
              in_R8 = (stbrp_node *)(ulong)psVar14->x;
              if (iVar5 + (int)local_50 < (int)(uint)psVar14->x) goto LAB_001551e9;
              psVar11->next = context->free_head;
              context->free_head = psVar11;
              psVar11 = psVar14;
              in_R8 = psVar14->next;
            } while (psVar14->next != (stbrp_node *)0x0);
            in_R8 = (stbrp_node *)0x0;
          }
LAB_001551e9:
          psVar3->next = psVar11;
          iVar5 = (int)local_50 + iVar5;
          if ((int)(uint)psVar11->x < iVar5) {
            psVar11->x = (stbrp_coord)iVar5;
          }
          local_40->x = (stbrp_coord)local_88;
          local_40->y = (stbrp_coord)local_94;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar18);
  }
  qsort(rects,local_38,0x10,rect_original_order);
  if (0 < local_78) {
    lVar9 = 0;
    do {
      uVar15 = 1;
      if (*(short *)((long)&rects->x + lVar9) == -1) {
        uVar15 = (uint)(*(short *)((long)&rects->y + lVar9) != -1);
      }
      *(uint *)((long)&rects->was_packed + lVar9) = uVar15;
      lVar9 = lVar9 + 0x10;
    } while (uVar18 * 0x10 != lVar9);
  }
  return;
}

Assistant:

STBRP_DEF void stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
      #ifndef STBRP_LARGE_RECTS
      STBRP_ASSERT(rects[i].w <= 0xffff && rects[i].h <= 0xffff);
      #endif
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags
   for (i=0; i < num_rects; ++i)
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
}